

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cpp
# Opt level: O1

int __thiscall llvm::sys::unicode::columnWidthUTF8(unicode *this,StringRef Text)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  ConversionResult CVar4;
  int iVar5;
  char *pcVar6;
  int unaff_R12D;
  UTF32 buf [1];
  UTF32 *Target;
  UTF8 *Start;
  uint local_4c;
  int local_48;
  uint local_44;
  uint *local_40;
  unicode *local_38;
  
  local_48 = 0;
  pcVar6 = (char *)0x0;
  do {
    if (Text.Data <= pcVar6) {
      return local_48;
    }
    uVar3 = getNumBytesForUTF8((UTF8)this[(long)pcVar6]);
    if (uVar3 == 0) {
      return -2;
    }
    if (Text.Data < pcVar6 + uVar3) {
      return -2;
    }
    local_38 = (unicode *)(pcVar6 + (long)this);
    local_40 = &local_44;
    bVar2 = false;
    CVar4 = ConvertUTF8toUTF32((UTF8 **)&local_38,(UTF8 *)(local_38 + uVar3),&local_40,
                               (UTF32 *)&local_40,strictConversion);
    uVar1 = local_44;
    if (CVar4 == conversionOK) {
      bVar2 = isPrintable(local_44);
      iVar5 = -1;
      if (bVar2) {
        if (charWidth(int)::CombiningCharacters == '\0') {
          columnWidthUTF8();
        }
        local_4c = uVar1;
        bVar2 = std::binary_search<llvm::sys::UnicodeCharRange_const*,unsigned_int>
                          (charWidth(int)::CombiningCharacters,
                           charWidth(int)::CombiningCharacters + DAT_00248d38,&local_4c);
        iVar5 = 0;
        if (!bVar2) {
          if (charWidth(int)::DoubleWidthCharacters == '\0') {
            columnWidthUTF8();
          }
          local_4c = uVar1;
          bVar2 = std::binary_search<llvm::sys::UnicodeCharRange_const*,unsigned_int>
                            (charWidth(int)::DoubleWidthCharacters,
                             charWidth(int)::DoubleWidthCharacters + DAT_00248d50,&local_4c);
          iVar5 = bVar2 + 1;
        }
      }
      bVar2 = -1 < iVar5;
      if (!bVar2) {
        unaff_R12D = -1;
        iVar5 = 0;
      }
      local_48 = local_48 + iVar5;
    }
    else {
      unaff_R12D = -2;
    }
    pcVar6 = pcVar6 + uVar3;
  } while (bVar2);
  return unaff_R12D;
}

Assistant:

int columnWidthUTF8(StringRef Text) {
  unsigned ColumnWidth = 0;
  unsigned Length;
  for (size_t i = 0, e = Text.size(); i < e; i += Length) {
    Length = getNumBytesForUTF8(Text[i]);
    if (Length <= 0 || i + Length > Text.size())
      return ErrorInvalidUTF8;
    UTF32 buf[1];
    const UTF8 *Start = reinterpret_cast<const UTF8 *>(Text.data() + i);
    UTF32 *Target = &buf[0];
    if (conversionOK != ConvertUTF8toUTF32(&Start, Start + Length, &Target,
                                           Target + 1, strictConversion))
      return ErrorInvalidUTF8;
    int Width = charWidth(buf[0]);
    if (Width < 0)
      return ErrorNonPrintableCharacter;
    ColumnWidth += Width;
  }
  return ColumnWidth;
}